

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O2

bool __thiscall FIX::HttpParser::readHttpMessage(HttpParser *this,string *str)

{
  long lVar1;
  MessageParseError *this_00;
  allocator<char> local_41;
  string local_40;
  
  if (3 < (this->m_buffer)._M_string_length) {
    lVar1 = std::__cxx11::string::find((char *)this,0x1c9f5c);
    if (0x800 < (this->m_buffer)._M_string_length) {
      this_00 = (MessageParseError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
      MessageParseError::MessageParseError(this_00,&local_40);
      __cxa_throw(this_00,&MessageParseError::typeinfo,Exception::~Exception);
    }
    if (lVar1 != -1) {
      std::__cxx11::string::assign((string *)str,(ulong)this,0);
      std::__cxx11::string::erase((ulong)this,0);
      return true;
    }
  }
  return false;
}

Assistant:

EXCEPT(MessageParseError) {
  std::string::size_type pos = 0;

  if (m_buffer.length() < 4) {
    return false;
  }
  pos = m_buffer.find("\r\n\r\n");
  if (m_buffer.length() > 2048) {
    throw MessageParseError();
  }
  if (pos == std::string::npos) {
    return false;
  }
  str.assign(m_buffer, 0, pos + 4);
  m_buffer.erase(0, pos + 4);

  return true;
}